

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O0

Matrix44<float> * __thiscall Imath_3_2::Frustum<float>::projectionMatrix(Frustum<float> *this)

{
  long in_RSI;
  Matrix44<float> *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float F;
  float E;
  float twoTimesNear;
  float D;
  float farTimesNear;
  float C_1;
  float B_1;
  float A_1;
  float C;
  float B;
  float A;
  float tz;
  float ty;
  float tx;
  float farMinusNear;
  float farPlusNear;
  float topMinusBottom;
  float topPlusBottom;
  float rightMinusLeft;
  float rightPlusLeft;
  
  fVar1 = *(float *)(in_RSI + 0x14) + *(float *)(in_RSI + 0x10);
  fVar2 = *(float *)(in_RSI + 0x14) - *(float *)(in_RSI + 0x10);
  fVar3 = *(float *)(in_RSI + 0x18) + *(float *)(in_RSI + 0x1c);
  fVar4 = *(float *)(in_RSI + 0x18) - *(float *)(in_RSI + 0x1c);
  fVar5 = *(float *)(in_RSI + 0xc) + *(float *)(in_RSI + 8);
  fVar6 = *(float *)(in_RSI + 0xc) - *(float *)(in_RSI + 8);
  if ((*(byte *)(in_RSI + 0x20) & 1) == 0) {
    fVar7 = *(float *)(in_RSI + 8) * 2.0;
    Matrix44<float>::Matrix44
              (in_RDI,fVar7 / fVar2,0.0,0.0,0.0,0.0,fVar7 / fVar4,0.0,0.0,fVar1 / fVar2,
               fVar3 / fVar4,-fVar5 / fVar6,-1.0,0.0,0.0,
               (*(float *)(in_RSI + 0xc) * -2.0 * *(float *)(in_RSI + 8)) / fVar6,0.0);
  }
  else {
    Matrix44<float>::Matrix44
              (in_RDI,2.0 / fVar2,0.0,0.0,0.0,0.0,2.0 / fVar4,0.0,0.0,0.0,0.0,-2.0 / fVar6,0.0,
               -fVar1 / fVar2,-fVar3 / fVar4,-fVar5 / fVar6,1.0);
  }
  return in_RDI;
}

Assistant:

IMATH_CONSTEXPR14 inline Matrix44<T>
Frustum<T>::projectionMatrix () const IMATH_NOEXCEPT
{
    T rightPlusLeft  = _right + _left;
    T rightMinusLeft = _right - _left;

    T topPlusBottom  = _top + _bottom;
    T topMinusBottom = _top - _bottom;

    T farPlusNear  = _farPlane + _nearPlane;
    T farMinusNear = _farPlane - _nearPlane;

    if (_orthographic)
    {
        T tx = -rightPlusLeft / rightMinusLeft;
        T ty = -topPlusBottom / topMinusBottom;
        T tz = -farPlusNear / farMinusNear;

        T A = T (2) / rightMinusLeft;
        T B = T (2) / topMinusBottom;
        T C = T (-2) / farMinusNear;

        return Matrix44<T> (
            A, 0, 0, 0, 0, B, 0, 0, 0, 0, C, 0, tx, ty, tz, 1.f);
    }
    else
    {
        T A = rightPlusLeft / rightMinusLeft;
        T B = topPlusBottom / topMinusBottom;
        T C = -farPlusNear / farMinusNear;

        T farTimesNear = T (-2) * _farPlane * _nearPlane;

        T D = farTimesNear / farMinusNear;

        T twoTimesNear = T (2) * _nearPlane;

        T E = twoTimesNear / rightMinusLeft;
        T F = twoTimesNear / topMinusBottom;

        return Matrix44<T> (E, 0, 0, 0, 0, F, 0, 0, A, B, C, -1, 0, 0, D, 0);
    }
}